

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void fread_charmie(CHAR_DATA *ch,FILE *fp)

{
  int iVar1;
  int iVar2;
  MOB_INDEX_DATA *pMVar3;
  CHAR_DATA *ch_00;
  char *pcVar4;
  ROOM_INDEX_DATA *pRoomIndex;
  string_view fmt;
  int vnum;
  AFFECT_DATA af;
  
  iVar1 = fread_number(fp);
  vnum = iVar1;
  pMVar3 = get_mob_index(iVar1);
  if (pMVar3 == (MOB_INDEX_DATA *)0x0) {
    fmt._M_str = "Fread_charmie: bad vnum {}!!!!";
    fmt._M_len = 0x1e;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&vnum);
    iVar1 = 0x6012;
  }
  pMVar3 = get_mob_index(iVar1);
  ch_00 = create_mobile(pMVar3);
  iVar1 = fread_number(fp);
  free_pstring(ch_00->short_descr);
  free_pstring(ch_00->long_descr);
  free_pstring(ch_00->name);
  pcVar4 = fread_string(fp);
  ch_00->name = pcVar4;
  pcVar4 = fread_string(fp);
  ch_00->short_descr = pcVar4;
  pcVar4 = fread_string(fp);
  ch_00->long_descr = pcVar4;
  iVar2 = fread_number(fp);
  ch_00->level = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->max_hit = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->hit = iVar2;
  iVar2 = fread_number(fp);
  ch_00->size = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->alignment = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->damage[0] = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->damage[1] = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->damroll = (short)iVar2;
  iVar2 = fread_number(fp);
  ch_00->defense_mod = (short)iVar2;
  pRoomIndex = get_room_index(iVar1);
  char_to_room(ch_00,pRoomIndex);
  add_follower(ch_00,ch);
  ch_00->leader = ch;
  init_affect(&af);
  af.where = 0;
  af.level = ch->level;
  af.aftype = 0;
  af.modifier = 0;
  af.duration = -1;
  af.location = 0;
  af.bitvector[0]._2_1_ = af.bitvector[0]._2_1_ | 4;
  iVar1 = skill_lookup("charm person");
  af.type = (short)iVar1;
  if (ch_00->pIndexData->vnum == 0xb55) {
    iVar1 = skill_lookup("animate dead");
    af.type = (short)iVar1;
  }
  affect_to_char(ch_00,&af);
  return;
}

Assistant:

void fread_charmie(CHAR_DATA *ch, FILE *fp)
{
	int vnum, roomvnum;
	CHAR_DATA *charmed;
	AFFECT_DATA af;
	vnum = fread_number(fp);

	if (get_mob_index(vnum) == nullptr)
	{
		RS.Logger.Warn("Fread_charmie: bad vnum {}!!!!", vnum);
		charmed = create_mobile(get_mob_index(24594));
	}
	else
	{
		charmed = create_mobile(get_mob_index(vnum));
	}

	roomvnum = fread_number(fp);

	free_pstring(charmed->short_descr);
	free_pstring(charmed->long_descr);
	free_pstring(charmed->name);

	charmed->name = fread_string(fp);
	charmed->short_descr = fread_string(fp);
	charmed->long_descr = fread_string(fp);
	charmed->level = fread_number(fp);
	charmed->max_hit = fread_number(fp);
	charmed->hit = fread_number(fp);
	charmed->size = fread_number(fp);
	charmed->alignment = fread_number(fp);
	charmed->damage[DICE_NUMBER] = fread_number(fp);
	charmed->damage[DICE_TYPE] = fread_number(fp);
	charmed->damroll = fread_number(fp);
	charmed->defense_mod = fread_number(fp);

	char_to_room(charmed, get_room_index(roomvnum));
	add_follower(charmed, ch);

	charmed->leader = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.level = ch->level;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;

	SET_BIT(af.bitvector, AFF_CHARM);

	af.type = skill_lookup("charm person");

	if (charmed->pIndexData->vnum == MOB_VNUM_ZOMBIE)
		af.type = skill_lookup("animate dead");

	affect_to_char(charmed, &af);
}